

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::NodeHelper_CloseNode(X3DExporter *this,string *pNodeName,size_t pTabLevel)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  IndentationStringSet(this,pTabLevel);
  XML_Write(this,&this->mIndentationString);
  std::operator+(&local_38,"</",pNodeName);
  std::operator+(&bStack_58,&local_38,">\n");
  XML_Write(this,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void X3DExporter::NodeHelper_CloseNode(const string& pNodeName, const size_t pTabLevel)
{
	// Write indentation.
	IndentationStringSet(pTabLevel);
	XML_Write(mIndentationString);
	// Write element
	XML_Write("</" + pNodeName + ">\n");
}